

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# repeated_ptr_field.h
# Opt level: O2

Type * google::protobuf::internal::
       GenericTypeHandler<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
       ::New(Arena *arena,Type *value)

{
  Type *this;
  
  if (arena == (Arena *)0x0) {
    this = (Type *)operator_new(0x20);
  }
  else {
    this = (Type *)ThreadSafeArena::AllocateFromStringBlock(&arena->impl_);
  }
  std::__cxx11::string::string((string *)this,(string *)value);
  return this;
}

Assistant:

static PROTOBUF_NOINLINE Type* New(Arena* arena, Type&& value) {
    return Arena::Create<Type>(arena, std::move(value));
  }